

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O3

bool __thiscall
glcts::GeometryShaderMaxOutputComponentsSinglePointTest::verifyResult
          (GeometryShaderMaxOutputComponentsSinglePointTest *this,void *data)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  GLint expected_value;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [376];
  
  iVar5 = (this->m_n_available_vectors * 4 + 1) * this->m_n_available_vectors * 4 >> 1;
  lVar4 = 0;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    lVar6 = 0;
    bVar1 = true;
    do {
      bVar3 = bVar1;
      bVar7 = *(int *)((long)data + lVar6 * 0x10 + lVar4 * 0x20) != iVar5;
      if (bVar7) {
        local_1b0 = (undefined1  [8])
                    ((this->super_GeometryShaderLimitsRenderingBase).super_TestCaseBase.
                     super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Wrong result! Expected: ",0x18);
        std::ostream::operator<<(local_1a8,iVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," Extracted: ",0xc);
        std::ostream::operator<<(local_1a8,*(int *)((long)data + lVar6 * 0x10 + lVar4 * 0x20));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  X: ",5);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," Y: ",4);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        goto LAB_00d0a6c9;
      }
      lVar6 = 1;
      bVar1 = false;
    } while (bVar3);
    lVar4 = 1;
    bVar1 = false;
  } while (bVar2);
LAB_00d0a6c9:
  return !bVar7;
}

Assistant:

bool GeometryShaderMaxOutputComponentsSinglePointTest::verifyResult(const void* data)
{
	const unsigned char* result_image			= (const unsigned char*)data;
	const unsigned int   line_size				= m_texture_width * m_texture_pixel_size;
	const glw::GLint	 n_components_per_point = m_n_available_vectors * 4; /* 4 components per vector */

	const glw::GLint first_value	= 1;
	const glw::GLint last_value		= n_components_per_point;
	const glw::GLint expected_value = ((first_value + last_value) * n_components_per_point) / 2;

	/* Verify all pixels that belong to point, area m_point_size x m_point_size */
	for (unsigned int y = 0; y < m_point_size; ++y)
	{
		const unsigned int line_offset = y * line_size;

		for (unsigned int x = 0; x < m_point_size; ++x)
		{
			const unsigned int texel_offset = line_offset + x * m_texture_pixel_size;

			if (0 != memcmp(result_image + texel_offset, &expected_value, sizeof(expected_value)))
			{
				const glw::GLint* result_value = (const glw::GLint*)(result_image + texel_offset);

				m_testCtx.getLog() << tcu::TestLog::Message << "Wrong result! Expected: " << expected_value
								   << " Extracted: " << *result_value << "  X: " << x << " Y: " << y
								   << tcu::TestLog::EndMessage;

				return false;
			}
		}
	}

	return true;
}